

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

hwaddr m68k_cpu_get_phys_page_debug_m68k(CPUState *cs,vaddr addr)

{
  int iVar1;
  target_ulong_conflict local_44;
  int local_40;
  target_ulong_conflict page_size;
  int access_type;
  int prot;
  hwaddr phys_addr;
  CPUM68KState_conflict *env;
  M68kCPU *cpu;
  vaddr addr_local;
  CPUState *cs_local;
  
  phys_addr = (hwaddr)(cs[1].tb_jmp_cache + 0x8f);
  cs_local = (CPUState *)addr;
  if (((ulong)cs[1].tb_jmp_cache[0xb8] & 0x8000) != 0) {
    local_40 = 0x24;
    if ((*(uint *)((long)cs[1].tb_jmp_cache + 0x4bc) & 0x2000) != 0) {
      local_40 = 0x25;
    }
    env = (CPUM68KState_conflict *)cs;
    cpu = (M68kCPU *)addr;
    addr_local = (vaddr)cs;
    iVar1 = get_physical_address
                      ((CPUM68KState_conflict *)phys_addr,(hwaddr *)&access_type,(int *)&page_size,
                       (target_ulong_conflict)addr,local_40,&local_44);
    if (iVar1 == 0) {
      cs_local = _access_type;
    }
    else {
      cs_local = (CPUState *)0xffffffffffffffff;
    }
  }
  return (hwaddr)cs_local;
}

Assistant:

hwaddr m68k_cpu_get_phys_page_debug(CPUState *cs, vaddr addr)
{
    M68kCPU *cpu = M68K_CPU(cs);
    CPUM68KState *env = &cpu->env;
    hwaddr phys_addr;
    int prot;
    int access_type;
    target_ulong page_size;

    if ((env->mmu.tcr & M68K_TCR_ENABLED) == 0) {
        /* MMU disabled */
        return addr;
    }

    access_type = ACCESS_DATA | ACCESS_DEBUG;
    if (env->sr & SR_S) {
        access_type |= ACCESS_SUPER;
    }
    if (get_physical_address(env, &phys_addr, &prot,
                             addr, access_type, &page_size) != 0) {
        return -1;
    }
    return phys_addr;
}